

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvcc_functional_test.cc
# Opt level: O0

void rollback_to_wal_test(bool multi_kv)

{
  fdb_status fVar1;
  int iVar2;
  size_t sVar3;
  char *pcVar4;
  void *pvVar5;
  fdb_kvs_handle *in_stack_fffffffffffff138;
  fdb_file_handle *in_stack_fffffffffffff140;
  fdb_doc **in_stack_fffffffffffff148;
  size_t in_stack_fffffffffffff160;
  fdb_seqnum_t in_stack_fffffffffffff260;
  fdb_kvs_handle **in_stack_fffffffffffff268;
  fdb_config *in_stack_fffffffffffff358;
  char *in_stack_fffffffffffff360;
  fdb_file_handle **in_stack_fffffffffffff368;
  fdb_seqnum_t in_stack_fffffffffffff3e0;
  fdb_kvs_handle **in_stack_fffffffffffff3e8;
  fdb_kvs_handle *in_stack_fffffffffffff3f0;
  fdb_kvs_handle *local_568 [2];
  undefined4 local_558;
  undefined4 local_554;
  undefined1 *local_550;
  char *local_548;
  size_t local_540;
  char *local_538;
  size_t local_530;
  uint32_t *local_528;
  undefined1 *local_520;
  char *local_518;
  size_t local_510;
  char *local_508;
  size_t local_500;
  uint32_t *local_4f8;
  int local_4ec;
  undefined1 *local_4e8;
  char *local_4e0;
  size_t local_4d8;
  char *local_4d0;
  size_t local_4c8;
  uint32_t *local_4c0;
  fdb_kvs_config kvs_config;
  fdb_config fconfig;
  char bodybuf [256];
  char metabuf [256];
  char keybuf [256];
  fdb_doc *pfStack_a0;
  fdb_status status;
  fdb_doc *rdoc;
  fdb_doc **doc;
  fdb_kvs_handle *snap_db;
  fdb_kvs_handle **db;
  fdb_file_handle *dbfile;
  int num_kvs;
  int n;
  int r;
  int i;
  timeval __test_interval_ins;
  timeval __test_interval_total;
  timeval __test_cur;
  timeval __test_prev;
  timeval __test_begin;
  bool multi_kv_local;
  
  local_568[1] = (fdb_kvs_handle *)0x11da20;
  gettimeofday((timeval *)&__test_prev.tv_usec,(__timezone_ptr_t)0x0);
  local_568[1] = (fdb_kvs_handle *)0x11da2d;
  memleak_start();
  system("rm -rf  mvcc_test* > errorlog.txt");
  fdb_get_default_config();
  fdb_get_default_kvs_config();
  fconfig.chunksize = 0;
  fconfig._2_2_ = 0;
  fconfig.blocksize = 0;
  fconfig.buffercache_size = 0x100;
  fconfig.purging_interval = 1;
  fconfig.flags._3_1_ = 0;
  fconfig.compactor_sleep_duration._0_1_ = multi_kv;
  fdb_open(in_stack_fffffffffffff368,in_stack_fffffffffffff360,in_stack_fffffffffffff358);
  fdb_kvs_open_default
            (in_stack_fffffffffffff140,(fdb_kvs_handle **)in_stack_fffffffffffff138,
             (fdb_kvs_config *)0x11dafc);
  for (num_kvs = 0; num_kvs < 1; num_kvs = num_kvs + 1) {
    fVar1 = fdb_set_log_callback(local_568[num_kvs],logCallbackFunc,"rollback_to_wal_test");
    if (fVar1 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
              ,0x1154);
      rollback_to_wal_test::__test_pass = 0;
      if (fVar1 != FDB_RESULT_SUCCESS) {
        __assert_fail("status == FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                      ,0x1154,"void rollback_to_wal_test(bool)");
      }
    }
  }
  for (n = 0; n < 300; n = n + 1) {
    sprintf(metabuf + 0xf8,"key%d",(ulong)(uint)n);
    sprintf(bodybuf + 0xf8,"meta%d",(ulong)(uint)n);
    sprintf((char *)&fconfig.num_blocks_readahead,"body%d",(ulong)(uint)n);
    local_4e8 = &stack0xfffffffffffff138 + (long)n * 8;
    local_4e0 = metabuf + 0xf8;
    local_4d8 = strlen(metabuf + 0xf8);
    local_4d0 = bodybuf + 0xf8;
    local_4c8 = strlen(bodybuf + 0xf8);
    local_4c0 = &fconfig.num_blocks_readahead;
    pvVar5 = (void *)0x11dc77;
    sVar3 = strlen((char *)&fconfig.num_blocks_readahead);
    fdb_doc_create(in_stack_fffffffffffff148,in_stack_fffffffffffff140,
                   (size_t)in_stack_fffffffffffff138,pvVar5,sVar3,(void *)0x11dcae,
                   in_stack_fffffffffffff160);
    fdb_set(local_568[0],*(fdb_doc **)(&stack0xfffffffffffff138 + (long)n * 8));
  }
  fdb_commit((fdb_file_handle *)in_stack_fffffffffffff138,'\0');
  for (n = 0; local_4ec = n, n < 0x96; n = n + 1) {
    fdb_doc_free((fdb_doc *)0x11dd25);
    sprintf(metabuf + 0xf8,"key%d",(ulong)(uint)n);
    sprintf(bodybuf + 0xf8,"META%d",(ulong)(uint)n);
    sprintf((char *)&fconfig.num_blocks_readahead,"BODY%d",(ulong)(uint)n);
    local_520 = &stack0xfffffffffffff138 + (long)n * 8;
    local_518 = metabuf + 0xf8;
    local_510 = strlen(metabuf + 0xf8);
    local_508 = bodybuf + 0xf8;
    local_500 = strlen(bodybuf + 0xf8);
    local_4f8 = &fconfig.num_blocks_readahead;
    pvVar5 = (void *)0x11dde2;
    sVar3 = strlen((char *)&fconfig.num_blocks_readahead);
    fdb_doc_create(in_stack_fffffffffffff148,in_stack_fffffffffffff140,
                   (size_t)in_stack_fffffffffffff138,pvVar5,sVar3,(void *)0x11de19,
                   in_stack_fffffffffffff160);
    fdb_set(local_568[0],*(fdb_doc **)(&stack0xfffffffffffff138 + (long)n * 8));
  }
  fdb_commit((fdb_file_handle *)in_stack_fffffffffffff138,'\0');
  for (; n < 300; n = n + 1) {
    fdb_doc_free((fdb_doc *)0x11de71);
    sprintf(metabuf + 0xf8,"key%d",(ulong)(uint)n);
    sprintf(bodybuf + 0xf8,"Meta%d",(ulong)(uint)n);
    sprintf((char *)&fconfig.num_blocks_readahead,"Body%d",(ulong)(uint)n);
    local_550 = &stack0xfffffffffffff138 + (long)n * 8;
    local_548 = metabuf + 0xf8;
    local_540 = strlen(metabuf + 0xf8);
    local_538 = bodybuf + 0xf8;
    local_530 = strlen(bodybuf + 0xf8);
    local_528 = &fconfig.num_blocks_readahead;
    pvVar5 = (void *)0x11df2e;
    sVar3 = strlen((char *)&fconfig.num_blocks_readahead);
    fdb_doc_create(in_stack_fffffffffffff148,in_stack_fffffffffffff140,
                   (size_t)in_stack_fffffffffffff138,pvVar5,sVar3,(void *)0x11df65,
                   in_stack_fffffffffffff160);
    fdb_set(local_568[0],*(fdb_doc **)(&stack0xfffffffffffff138 + (long)n * 8));
  }
  fdb_commit((fdb_file_handle *)in_stack_fffffffffffff138,'\0');
  local_554 = 300;
  pvVar5 = (void *)0x11dfc7;
  fVar1 = fdb_rollback(in_stack_fffffffffffff268,in_stack_fffffffffffff260);
  if (fVar1 != FDB_RESULT_SUCCESS) {
    pvVar5 = (void *)0x11dffa;
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
            ,0x1180);
    rollback_to_wal_test::__test_pass = 0;
    if (fVar1 != FDB_RESULT_SUCCESS) {
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0x1180,"void rollback_to_wal_test(bool)");
    }
  }
  fdb_doc_create(in_stack_fffffffffffff148,in_stack_fffffffffffff140,
                 (size_t)in_stack_fffffffffffff138,pvVar5,0,(void *)0x11e07f,
                 in_stack_fffffffffffff160);
  local_558 = 300;
  fVar1 = fdb_snapshot_open(in_stack_fffffffffffff3f0,in_stack_fffffffffffff3e8,
                            in_stack_fffffffffffff3e0);
  if (fVar1 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
            ,0x1184);
    rollback_to_wal_test::__test_pass = 0;
    if (fVar1 != FDB_RESULT_SUCCESS) {
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0x1184,"void rollback_to_wal_test(bool)");
    }
  }
  fVar1 = fdb_get((fdb_kvs_handle *)doc,pfStack_a0);
  if (fVar1 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
            ,0x1186);
    rollback_to_wal_test::__test_pass = 0;
    if (fVar1 != FDB_RESULT_SUCCESS) {
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0x1186,"void rollback_to_wal_test(bool)");
    }
  }
  iVar2 = memcmp(pfStack_a0->body,(void *)in_stack_fffffffffffff140[1].flags,pfStack_a0->bodylen);
  if (iVar2 == 0) {
    if (pfStack_a0->seqnum != 0x12e) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
              ,0x1188);
      rollback_to_wal_test::__test_pass = 0;
      if (pfStack_a0->seqnum != 0x12e) {
        __assert_fail("rdoc->seqnum == (fdb_seqnum_t)n + i + 1",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                      ,0x1188,"void rollback_to_wal_test(bool)");
      }
    }
    fdb_doc_free((fdb_doc *)0x11e2d6);
    fdb_kvs_close(in_stack_fffffffffffff138);
    fdb_close((fdb_file_handle *)in_stack_fffffffffffff138);
    for (n = 0; n < 300; n = n + 1) {
      fdb_doc_free((fdb_doc *)0x11e30e);
    }
    fdb_shutdown();
    memleak_end();
    pcVar4 = "single kv mode:";
    if (multi_kv) {
      pcVar4 = "multiple kv mode:";
    }
    sprintf((char *)&fconfig.num_blocks_readahead,"rollback to wal test %s",pcVar4);
    if (rollback_to_wal_test::__test_pass == 0) {
      fprintf(_stderr,"%s FAILED\n",&fconfig.num_blocks_readahead);
    }
    else {
      fprintf(_stderr,"%s PASSED\n",&fconfig.num_blocks_readahead);
    }
    return;
  }
  fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",in_stack_fffffffffffff140[1].flags,
          pfStack_a0->body,
          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
          ,0x1187);
  rollback_to_wal_test::__test_pass = 0;
  __assert_fail("false",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                ,0x1187,"void rollback_to_wal_test(bool)");
}

Assistant:

void rollback_to_wal_test(bool multi_kv)
{
    TEST_INIT();

    memleak_start();

    int i, r;
    int n = 300;
    int num_kvs = 1;
    fdb_file_handle *dbfile;
    fdb_kvs_handle **db = alca(fdb_kvs_handle *, num_kvs);
    fdb_kvs_handle *snap_db;
    fdb_doc **doc = alca(fdb_doc*, n);
    fdb_doc *rdoc;
    fdb_status status;

    char keybuf[256], metabuf[256], bodybuf[256];

    // remove previous mvcc_test files
    r = system(SHELL_DEL" mvcc_test* > errorlog.txt");
    (void)r;

    fdb_config fconfig = fdb_get_default_config();
    fdb_kvs_config kvs_config = fdb_get_default_kvs_config();
    fconfig.buffercache_size = 0;
    fconfig.wal_threshold = 256;
    fconfig.flags = FDB_OPEN_FLAG_CREATE;
    fconfig.compaction_threshold = 0;
    fconfig.multi_kv_instances = multi_kv;

    // open db
    fdb_open(&dbfile, "./mvcc_test8", &fconfig);

    fdb_kvs_open_default(dbfile, &db[0], &kvs_config);

    for (r = 0; r < num_kvs; ++r) {
        status = fdb_set_log_callback(db[r], logCallbackFunc,
                                      (void *) "rollback_to_wal_test");
        TEST_CHK(status == FDB_RESULT_SUCCESS);
    }

   // ------- Setup test ----------------------------------
    for (i=0; i<n; i++){
        sprintf(keybuf, "key%d", i);
        sprintf(metabuf, "meta%d", i);
        sprintf(bodybuf, "body%d", i);
        fdb_doc_create(&doc[i], (void*)keybuf, strlen(keybuf),
            (void*)metabuf, strlen(metabuf), (void*)bodybuf, strlen(bodybuf));
        fdb_set(db[0], doc[i]);
    } // after 256 items wal gets flushed before commit

    // commit normal but as wal was flushed, this will cause a wal flush again!
    fdb_commit(dbfile, FDB_COMMIT_NORMAL);

    // update first half documents again
    for (i = 0; i < n/2; i++){
        fdb_doc_free(doc[i]);
        sprintf(keybuf, "key%d", i);
        sprintf(metabuf, "META%d", i);
        sprintf(bodybuf, "BODY%d", i);
        fdb_doc_create(&doc[i], (void*)keybuf, strlen(keybuf),
            (void*)metabuf, strlen(metabuf), (void*)bodybuf, strlen(bodybuf));
        fdb_set(db[0], doc[i]);
    }

    // commit again, this time wal threshold not hit so no wal flush on commit
    fdb_commit(dbfile, FDB_COMMIT_NORMAL);

    // update remaining half documents
    for (; i < n; i++){
        fdb_doc_free(doc[i]);
        sprintf(keybuf, "key%d", i);
        sprintf(metabuf, "Meta%d", i);
        sprintf(bodybuf, "Body%d", i);
        fdb_doc_create(&doc[i], (void*)keybuf, strlen(keybuf),
            (void*)metabuf, strlen(metabuf), (void*)bodybuf, strlen(bodybuf));
        fdb_set(db[0], doc[i]);
    } // somewhere in this loop wal gets flushed before commit
    // normal commit results in wal flush
    fdb_commit(dbfile, FDB_COMMIT_NORMAL);

    status = fdb_rollback(&db[0], n + n/2);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    i = 1; // pick a document in the WAL section upon rollback
    fdb_doc_create(&rdoc, doc[i]->key, doc[i]->keylen, NULL, 0, NULL, 0);
    status = fdb_snapshot_open(db[0], &snap_db, n + n/2);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    status = fdb_get(snap_db, rdoc);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    TEST_CMP(rdoc->body, doc[i]->body, rdoc->bodylen);
    TEST_CHK(rdoc->seqnum == (fdb_seqnum_t)n + i + 1);
    fdb_doc_free(rdoc);
    fdb_kvs_close(snap_db);

    // close db file
    fdb_close(dbfile);

    // free all documents
    for (i=0;i<n;++i){
        fdb_doc_free(doc[i]);
    }

    // free all resources
    fdb_shutdown();

    memleak_end();

    sprintf(bodybuf, "rollback to wal test %s", multi_kv ? "multiple kv mode:"
                                                         : "single kv mode:");
    TEST_RESULT(bodybuf);
}